

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoPyramid>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoPyramid> *this,int64_t id,TPZVec<long> *nodeindexes,
          int matind,TPZGeoMesh *mesh)

{
  long lVar1;
  
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_01888270;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_01887ec8,id,matind,mesh);
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_01887bc8;
  pzgeom::TPZNodeRep<5,_pztopology::TPZPyramid>::TPZNodeRep
            (&(this->fGeo).super_TPZNodeRep<5,_pztopology::TPZPyramid>,&PTR_PTR_0188d828,nodeindexes
            );
  (this->fGeo).super_TPZNodeRep<5,_pztopology::TPZPyramid>.super_TPZPyramid.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZGeoPyramid_0188d7d0;
  lVar1 = 0;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar1) =
         &PTR__TPZGeoElSideIndex_0187bb90;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar1) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar1) = 0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x1c8);
  lVar1 = 0;
  do {
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar1) = 0xffffffffffffffff;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar1) = 0xffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x1c8);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(int64_t id,TPZVec<int64_t> &nodeindexes,int matind,TPZGeoMesh &mesh) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(id,matind,mesh) , fGeo(nodeindexes) {
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
    fGeo.Initialize(this);
}